

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::UTF16CollationIterator::backwardNumCodePoints
          (UTF16CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  UChar *pUVar1;
  bool bVar2;
  UChar32 c;
  UErrorCode *param_2_local;
  int32_t num_local;
  UTF16CollationIterator *this_local;
  
  param_2_local._4_4_ = num;
  while( true ) {
    bVar2 = false;
    if (0 < param_2_local._4_4_) {
      bVar2 = this->pos != this->start;
    }
    if (!bVar2) break;
    pUVar1 = this->pos;
    this->pos = pUVar1 + -1;
    param_2_local._4_4_ = param_2_local._4_4_ + -1;
    if ((((pUVar1[-1] & 0xfc00U) == 0xdc00) && (this->pos != this->start)) &&
       ((this->pos[-1] & 0xfc00U) == 0xd800)) {
      this->pos = this->pos + -1;
    }
  }
  return;
}

Assistant:

void
UTF16CollationIterator::backwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    while(num > 0 && pos != start) {
        UChar32 c = *--pos;
        --num;
        if(U16_IS_TRAIL(c) && pos != start && U16_IS_LEAD(*(pos-1))) {
            --pos;
        }
    }
}